

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

iterator __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
::erase(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        *this,const_iterator cpos)

{
  iterator ppPVar1;
  iterator ppPVar2;
  long in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  iterator pos;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffffc0;
  ParsedParameter **local_18;
  
  local_18 = begin(in_RDI);
  ppPVar1 = begin(in_RDI);
  local_18 = local_18 + (in_RSI - (long)ppPVar1 >> 3);
  while( true ) {
    ppPVar1 = end(in_stack_ffffffffffffffc0);
    if (local_18 == ppPVar1 + -1) break;
    *local_18 = local_18[1];
    local_18 = local_18 + 1;
  }
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::destroy<pbrt::ParsedParameter*>
            ((polymorphic_allocator<pbrt::ParsedParameter*> *)in_RDI,local_18);
  in_RDI->nStored = in_RDI->nStored - 1;
  ppPVar1 = begin(in_RDI);
  ppPVar2 = begin(in_RDI);
  return ppPVar1 + (in_RSI - (long)ppPVar2 >> 3);
}

Assistant:

iterator erase(const_iterator cpos) {
        iterator pos =
            begin() + (cpos - begin());  // non-const iterator, thank you very much
        while (pos != end() - 1) {
            *pos = std::move(*(pos + 1));
            ++pos;
        }
        alloc.destroy(pos);
        --nStored;
        return begin() + (cpos - begin());
    }